

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

void __thiscall lambda::parse_from::helper::unexpected_thing(helper *this)

{
  int iVar1;
  Parse_error *pPVar2;
  Shared_string local_50;
  undefined1 local_35;
  Shared_string local_28;
  helper *local_10;
  helper *this_local;
  
  local_10 = this;
  iVar1 = std::istream::peek();
  if (iVar1 == -1) {
    local_35 = 1;
    pPVar2 = (Parse_error *)__cxa_allocate_exception(0x20);
    ublib::Shared_string::Shared_string(&local_28,"unexpected end of file");
    Parse_error::Parse_error(pPVar2,&local_28);
    local_35 = 0;
    __cxa_throw(pPVar2,&Parse_error::typeinfo,Parse_error::~Parse_error);
  }
  pPVar2 = (Parse_error *)__cxa_allocate_exception(0x20);
  ublib::Shared_string::Shared_string(&local_50,"unexpected character");
  Parse_error::Parse_error(pPVar2,&local_50);
  __cxa_throw(pPVar2,&Parse_error::typeinfo,Parse_error::~Parse_error);
}

Assistant:

[[noreturn]] void unexpected_thing() {
      if (inp.peek() == eof) {
        throw Parse_error("unexpected end of file");
      } else {
        throw Parse_error("unexpected character");
      }
    }